

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O0

Trampoline * __thiscall
OrMeaning::Eval(Trampoline *__return_storage_ptr__,OrMeaning *this,Sexp *act)

{
  bool bVar1;
  reference ppSVar2;
  Sexp *pSVar3;
  Sexp **arg;
  iterator __end1;
  iterator __begin1;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *__range1;
  Sexp *eval;
  FrameProtector local_20;
  FrameProtector __frame_prot;
  Sexp *act_local;
  OrMeaning *this_local;
  
  __frame_prot.protected_frame = (Frame *)act;
  FrameProtector::FrameProtector(&local_20,"Eval");
  FrameProtector::ProtectValue(&local_20,(Sexp **)&__frame_prot,"act");
  __range1 = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)0x0;
  FrameProtector::ProtectValue(&local_20,(Sexp **)&__range1,"eval");
  __end1 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::begin(&this->arguments);
  arg = (Sexp **)std::vector<Sexp_*,_std::allocator<Sexp_*>_>::end(&this->arguments);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>
                                *)&arg);
    if (!bVar1) {
      pSVar3 = GcHeap::AllocateBool(false);
      Trampoline::Trampoline(__return_storage_ptr__,pSVar3);
LAB_0014479d:
      FrameProtector::~FrameProtector(&local_20);
      return __return_storage_ptr__;
    }
    ppSVar2 = __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::
              operator*(&__end1);
    __range1 = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)
               Evaluate(*ppSVar2,(Sexp *)__frame_prot.protected_frame);
    bVar1 = Sexp::IsTruthy((Sexp *)__range1);
    if (bVar1) {
      pSVar3 = GcHeap::AllocateBool(true);
      Trampoline::Trampoline(__return_storage_ptr__,pSVar3);
      goto LAB_0014479d;
    }
    __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

Trampoline OrMeaning::Eval(Sexp *act) {
  GC_HELPER_FRAME;
  GC_PROTECT(act);
  GC_PROTECTED_LOCAL(eval);

  for (auto &arg : arguments) {
    eval = Evaluate(arg, act);
    if (eval->IsTruthy()) {
      return GcHeap::AllocateBool(true);
    }
  }

  return GcHeap::AllocateBool(false);
}